

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCompoundCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
cbtCompoundCollisionAlgorithm::preallocateChildAlgorithms
          (cbtCompoundCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0Wrap,
          cbtCollisionObjectWrapper *body1Wrap)

{
  uint uVar1;
  cbtCollisionShape *pcVar2;
  cbtCollisionAlgorithm **ptr;
  cbtDispatcher *pcVar3;
  int iVar4;
  cbtCollisionAlgorithm **ppcVar5;
  long lVar6;
  undefined4 extraout_var;
  long lVar7;
  cbtCollisionObjectWrapper *pcVar8;
  ulong uVar9;
  long lVar10;
  cbtCollisionObjectWrapper childWrap;
  cbtAlignedObjectArray<cbtCollisionAlgorithm_*> m_childCollisionAlgorithmsClosestPoints;
  cbtAlignedObjectArray<cbtCollisionAlgorithm_*> m_childCollisionAlgorithmsContact;
  cbtCollisionObjectWrapper *local_98;
  undefined8 local_90;
  cbtCollisionObject *local_88;
  cbtTransform *pcStack_80;
  undefined4 local_78;
  undefined4 local_74;
  cbtAlignedObjectArray<cbtCollisionAlgorithm_*> local_70;
  cbtAlignedObjectArray<cbtCollisionAlgorithm_*> local_50;
  
  pcVar8 = body1Wrap;
  if (this->m_isSwapped != false) {
    pcVar8 = body0Wrap;
    body0Wrap = body1Wrap;
  }
  pcVar2 = body0Wrap->m_shape;
  uVar1 = *(uint *)((long)&pcVar2[1]._vptr_cbtCollisionShape + 4);
  iVar4 = (this->m_childCollisionAlgorithms).m_size;
  lVar10 = (long)iVar4;
  if ((iVar4 <= (int)uVar1) && (iVar4 < (int)uVar1)) {
    if ((this->m_childCollisionAlgorithms).m_capacity < (int)uVar1) {
      if (uVar1 == 0) {
        ppcVar5 = (cbtCollisionAlgorithm **)0x0;
      }
      else {
        ppcVar5 = (cbtCollisionAlgorithm **)cbtAlignedAllocInternal((long)(int)uVar1 * 8,0x10);
      }
      lVar6 = (long)(this->m_childCollisionAlgorithms).m_size;
      if (0 < lVar6) {
        lVar7 = 0;
        do {
          ppcVar5[lVar7] = (this->m_childCollisionAlgorithms).m_data[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar6 != lVar7);
      }
      ptr = (this->m_childCollisionAlgorithms).m_data;
      if (ptr != (cbtCollisionAlgorithm **)0x0) {
        if ((this->m_childCollisionAlgorithms).m_ownsMemory == true) {
          cbtAlignedFreeInternal(ptr);
        }
        (this->m_childCollisionAlgorithms).m_data = (cbtCollisionAlgorithm **)0x0;
      }
      (this->m_childCollisionAlgorithms).m_ownsMemory = true;
      (this->m_childCollisionAlgorithms).m_data = ppcVar5;
      (this->m_childCollisionAlgorithms).m_capacity = uVar1;
    }
    if (iVar4 < (int)uVar1) {
      do {
        (this->m_childCollisionAlgorithms).m_data[lVar10] = (cbtCollisionAlgorithm *)0x0;
        lVar10 = lVar10 + 1;
      } while ((int)uVar1 != lVar10);
    }
  }
  (this->m_childCollisionAlgorithms).m_size = uVar1;
  if (0 < (int)uVar1) {
    lVar10 = 0x40;
    uVar9 = 0;
    do {
      if (pcVar2[3]._vptr_cbtCollisionShape == (_func_int **)0x0) {
        local_90 = *(undefined8 *)((long)pcVar2[1].m_userPointer + lVar10);
        local_88 = body0Wrap->m_collisionObject;
        pcStack_80 = body0Wrap->m_worldTransform;
        local_78 = 0xffffffff;
        local_74 = (undefined4)uVar9;
        pcVar3 = (this->super_cbtActivatingCollisionAlgorithm).super_cbtCollisionAlgorithm.
                 m_dispatcher;
        local_98 = body0Wrap;
        iVar4 = (*pcVar3->_vptr_cbtDispatcher[2])(pcVar3,&local_98,pcVar8,this->m_sharedManifold,1);
        (this->m_childCollisionAlgorithms).m_data[uVar9] =
             (cbtCollisionAlgorithm *)CONCAT44(extraout_var,iVar4);
        local_50.m_ownsMemory = true;
        local_50.m_data = (cbtCollisionAlgorithm **)0x0;
        local_50.m_size = 0;
        local_50.m_capacity = 0;
        local_70.m_ownsMemory = true;
        local_70.m_data = (cbtCollisionAlgorithm **)0x0;
        local_70.m_size = 0;
        local_70.m_capacity = 0;
        cbtAlignedObjectArray<cbtCollisionAlgorithm_*>::~cbtAlignedObjectArray(&local_70);
        cbtAlignedObjectArray<cbtCollisionAlgorithm_*>::~cbtAlignedObjectArray(&local_50);
      }
      else {
        (this->m_childCollisionAlgorithms).m_data[uVar9] = (cbtCollisionAlgorithm *)0x0;
      }
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x58;
    } while (uVar1 != uVar9);
  }
  return;
}

Assistant:

void cbtCompoundCollisionAlgorithm::preallocateChildAlgorithms(const cbtCollisionObjectWrapper* body0Wrap, const cbtCollisionObjectWrapper* body1Wrap)
{
	const cbtCollisionObjectWrapper* colObjWrap = m_isSwapped ? body1Wrap : body0Wrap;
	const cbtCollisionObjectWrapper* otherObjWrap = m_isSwapped ? body0Wrap : body1Wrap;
	cbtAssert(colObjWrap->getCollisionShape()->isCompound());

	const cbtCompoundShape* compoundShape = static_cast<const cbtCompoundShape*>(colObjWrap->getCollisionShape());

	int numChildren = compoundShape->getNumChildShapes();
	int i;

	m_childCollisionAlgorithms.resize(numChildren);
	for (i = 0; i < numChildren; i++)
	{
		if (compoundShape->getDynamicAabbTree())
		{
			m_childCollisionAlgorithms[i] = 0;
		}
		else
		{
			const cbtCollisionShape* childShape = compoundShape->getChildShape(i);

			cbtCollisionObjectWrapper childWrap(colObjWrap, childShape, colObjWrap->getCollisionObject(), colObjWrap->getWorldTransform(), -1, i);  //wrong child trans, but unused (hopefully)
			m_childCollisionAlgorithms[i] = m_dispatcher->findAlgorithm(&childWrap, otherObjWrap, m_sharedManifold, BT_CONTACT_POINT_ALGORITHMS);

			cbtAlignedObjectArray<cbtCollisionAlgorithm*> m_childCollisionAlgorithmsContact;
			cbtAlignedObjectArray<cbtCollisionAlgorithm*> m_childCollisionAlgorithmsClosestPoints;
		}
	}
}